

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O2

DecodePsbtUtxoStruct * __thiscall
cfd::api::json::DecodePsbtUtxo::ConvertToStruct
          (DecodePsbtUtxoStruct *__return_storage_ptr__,DecodePsbtUtxo *this)

{
  DecodePsbtLockingScriptStruct DStack_c8;
  
  DecodePsbtUtxoStruct::DecodePsbtUtxoStruct(__return_storage_ptr__);
  __return_storage_ptr__->amount = this->amount_;
  DecodePsbtLockingScript::ConvertToStruct(&DStack_c8,&this->script_pub_key_);
  DecodePsbtLockingScriptStruct::operator=(&__return_storage_ptr__->script_pub_key,&DStack_c8);
  DecodePsbtLockingScriptStruct::~DecodePsbtLockingScriptStruct(&DStack_c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

DecodePsbtUtxoStruct DecodePsbtUtxo::ConvertToStruct() const {  // NOLINT
  DecodePsbtUtxoStruct result;
  result.amount = amount_;
  result.script_pub_key = script_pub_key_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}